

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void osgen_delete_win(osgen_win_t *win)

{
  osgen_win_t *poVar1;
  osgen_win_t **ppoVar2;
  osgen_win_t **ppoVar3;
  osgen_win_t *poVar4;
  long lVar5;
  
  if (win->parent != (osgen_win_t *)0x0) {
    ppoVar2 = &win->parent->first_child;
    poVar1 = (osgen_win_t *)0x0;
    ppoVar3 = ppoVar2;
    do {
      poVar4 = poVar1;
      poVar1 = *ppoVar3;
      if (poVar1 == (osgen_win_t *)0x0) break;
      ppoVar3 = &poVar1->nxt;
    } while (poVar1 != win);
    if (poVar1 != (osgen_win_t *)0x0) {
      ppoVar3 = &poVar4->nxt;
      if (poVar4 == (osgen_win_t *)0x0) {
        ppoVar3 = ppoVar2;
      }
      *ppoVar3 = win->nxt;
    }
  }
  ppoVar3 = &win->first_child;
  while (poVar1 = *ppoVar3, poVar1 != (osgen_win_t *)0x0) {
    poVar1->parent = (osgen_win_t *)0x0;
    ppoVar3 = &poVar1->nxt;
  }
  if (win->win_type == 1) {
    lVar5 = 0x98;
  }
  else {
    if (win->win_type != 2) goto LAB_001ed256;
    lVar5 = 0x88;
  }
  free(win[1].parent);
  free(*(void **)((long)&win->win_type + lVar5));
LAB_001ed256:
  free(win);
  return;
}

Assistant:

static void osgen_delete_win(osgen_win_t *win)
{
    osgen_win_t *prv;
    osgen_win_t *cur;
    osgen_txtwin_t *twin;
    osgen_gridwin_t *gwin;

    /* if we have a parent, remove ourselves from our parent's child list */
    if (win->parent != 0)
    {
        /* scan our parent's child list */
        for (prv = 0, cur = win->parent->first_child ;
             cur != 0 && cur != win ;
             prv = cur, cur = cur->nxt) ;

        /* if we found it, unlink it */
        if (cur != 0)
        {
            /* set the previous item's forward pointer */
            if (prv == 0)
                win->parent->first_child = win->nxt;
            else
                prv->nxt = win->nxt;
        }
    }

    /* 
     *   Remove the parent reference from each child of this window.  We're
     *   going to be deleted, so we can't keep references from our children
     *   to us.  
     */
    for (cur = win->first_child ; cur != 0 ; cur = cur->nxt)
        cur->parent = 0;

    /* delete the window according to its type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXT:
        /* get the text window subclass data */
        twin = (osgen_txtwin_t *)win;

        /* delete its scrollback buffer, if it has one */
        if (twin->txtbuf != 0)
            osfree(twin->txtbuf);

        /* delete the line pointers */
        if (twin->line_ptr != 0)
            osfree(twin->line_ptr);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /* get the grid window subclass data */
        gwin = (osgen_gridwin_t *)win;

        /* delete the character and color arrays */
        if (gwin->grid_txt != 0)
            osfree(gwin->grid_txt);
        if (gwin->grid_color != 0)
            osfree(gwin->grid_color);
        break;
    }

    /* delete the window itself */
    osfree(win);
}